

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::~LinkedListPool
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  bool bVar1;
  reference ppaVar2;
  __normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
  *in_RDI;
  const_iterator it;
  const_iterator itend;
  vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
  in_stack_ffffffffffffffe0;
  
  std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>::end
            (in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<depspawn::internal::arg_info*const*,std::vector<depspawn::internal::arg_info*,std::allocator<depspawn::internal::arg_info*>>>
  ::__normal_iterator<depspawn::internal::arg_info**>
            (in_RDI,(__normal_iterator<depspawn::internal::arg_info_**,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>::
  begin(in_stack_ffffffffffffffc8);
  __gnu_cxx::
  __normal_iterator<depspawn::internal::arg_info*const*,std::vector<depspawn::internal::arg_info*,std::allocator<depspawn::internal::arg_info*>>>
  ::__normal_iterator<depspawn::internal::arg_info**>
            (in_RDI,(__normal_iterator<depspawn::internal::arg_info_**,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
                     *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
              ::operator*((__normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
                           *)&stack0xffffffffffffffe0);
    PoolAllocator_malloc_free<false>::free(*ppaVar2);
    __gnu_cxx::
    __normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
    ::operator++((__normal_iterator<depspawn::internal::arg_info_*const_*,_std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>::
  ~vector((vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_> *
          )in_stack_ffffffffffffffe0._M_current);
  return;
}

Assistant:

~LinkedListPool()
  {
    typename vector_t::const_iterator const itend = v_.end();
    for(typename vector_t::const_iterator it = v_.begin(); it != itend; ++it)
      PoolAllocator_malloc_free<SCALABLE>::free(reinterpret_cast<char*>(*it));
  }